

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void test(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int32_t k;
  ostream *poVar3;
  string infile;
  FastText fasttext;
  ifstream ifs;
  
  if (argc == 4) {
    k = 1;
  }
  else {
    if (argc != 5) {
      printTestUsage();
      goto LAB_001119fe;
    }
    k = atoi(argv[4]);
  }
  fasttext.input_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x40);
  fasttext.model_.super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  fasttext.model_.super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  fasttext.output_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  fasttext.output_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  fasttext._0_32_ =
       ZEXT1632((undefined1  [16])
                fasttext.input_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&ifs,argv[2],(allocator *)&infile);
  ::fasttext::FastText::loadModel(&fasttext,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::string((string *)&infile,argv[3],(allocator *)&ifs);
  bVar1 = std::operator==(&infile,"-");
  if (bVar1) {
    ::fasttext::FastText::test(&fasttext,(istream *)&std::cin,k);
  }
  else {
    std::ifstream::ifstream(&ifs,(string *)&infile,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Test file cannot be opened!");
      std::endl<char,std::char_traits<char>>(poVar3);
LAB_001119fe:
      exit(1);
    }
    ::fasttext::FastText::test(&fasttext,(istream *)&ifs,k);
    std::ifstream::close();
    std::ifstream::~ifstream(&ifs);
  }
  exit(0);
}

Assistant:

void test(int argc, char** argv) {
  int32_t k;
  if (argc == 4) {
    k = 1;
  } else if (argc == 5) {
    k = atoi(argv[4]);
  } else {
    printTestUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(argv[2]));
  std::string infile(argv[3]);
  if (infile == "-") {
    fasttext.test(std::cin, k);
  } else {
    std::ifstream ifs(infile);
    if (!ifs.is_open()) {
      std::cerr << "Test file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
    fasttext.test(ifs, k);
    ifs.close();
  }
  exit(0);
}